

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::ImageTargetGLES2::ImageTargetGLES2
          (ImageTargetGLES2 *this,EglTestContext *eglTestCtx,GLenum target)

{
  char *__rhs;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ApiType local_20;
  GLenum local_1c;
  EglTestContext *pEStack_18;
  GLenum target_local;
  EglTestContext *eglTestCtx_local;
  ImageTargetGLES2 *this_local;
  
  local_1c = target;
  pEStack_18 = eglTestCtx;
  eglTestCtx_local = (EglTestContext *)this;
  local_20 = glu::ApiType::es(2,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"image_target_gles2_",&local_61);
  __rhs = getTargetName(local_1c);
  std::operator+(&local_40,&local_60,__rhs);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Use EGLImage as GLES2 object",&local_99);
  ImageTestCase::ImageTestCase(&this->super_ImageTestCase,eglTestCtx,local_20,&local_40,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  (this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ImageTargetGLES2_0327d170;
  this->m_target = local_1c;
  return;
}

Assistant:

ImageTargetGLES2 (EglTestContext& eglTestCtx, GLenum target)
		: ImageTestCase	(eglTestCtx, ApiType::es(2, 0), string("image_target_gles2_") + getTargetName(target), "Use EGLImage as GLES2 object")
		, m_target		(target)
	{
	}